

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btCompoundCompoundCollisionAlgorithm::btCompoundCompoundCollisionAlgorithm
          (btCompoundCompoundCollisionAlgorithm *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  int iVar1;
  btHashedSimplePairCache *this_00;
  btCompoundShape *pbVar2;
  btCollisionObjectWrapper *in_RCX;
  btCollisionObjectWrapper *in_RDX;
  undefined8 *in_RDI;
  btCompoundShape *compoundShape1;
  btCompoundShape *compoundShape0;
  btCollisionObjectWrapper *col1ObjWrap;
  btCollisionObjectWrapper *col0ObjWrap;
  void *ptr;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffffa0;
  btCollisionObjectWrapper *in_stack_ffffffffffffffa8;
  btCollisionObjectWrapper *in_stack_ffffffffffffffb0;
  btCollisionAlgorithmConstructionInfo *in_stack_ffffffffffffffb8;
  btCompoundCollisionAlgorithm *in_stack_ffffffffffffffc0;
  
  btCompoundCollisionAlgorithm::btCompoundCollisionAlgorithm
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  *in_RDI = &PTR__btCompoundCompoundCollisionAlgorithm_002e2f10;
  btAlignedObjectArray<btSimplePair>::btAlignedObjectArray
            ((btAlignedObjectArray<btSimplePair> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  this_00 = (btHashedSimplePairCache *)
            btAlignedAllocInternal
                      (CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
  btHashedSimplePairCache::btHashedSimplePairCache(this_00);
  in_RDI[9] = this_00;
  pbVar2 = (btCompoundShape *)btCollisionObjectWrapper::getCollisionShape(in_RDX);
  iVar1 = btCompoundShape::getUpdateRevision(pbVar2);
  *(int *)(in_RDI + 0xe) = iVar1;
  pbVar2 = (btCompoundShape *)btCollisionObjectWrapper::getCollisionShape(in_RCX);
  iVar1 = btCompoundShape::getUpdateRevision(pbVar2);
  *(int *)((long)in_RDI + 0x74) = iVar1;
  return;
}

Assistant:

btCompoundCompoundCollisionAlgorithm::btCompoundCompoundCollisionAlgorithm( const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped)
:btCompoundCollisionAlgorithm(ci,body0Wrap,body1Wrap,isSwapped)
{

	void* ptr = btAlignedAlloc(sizeof(btHashedSimplePairCache),16);
	m_childCollisionAlgorithmCache= new(ptr) btHashedSimplePairCache();

	const btCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	btAssert (col0ObjWrap->getCollisionShape()->isCompound());

	const btCollisionObjectWrapper* col1ObjWrap = body1Wrap;
	btAssert (col1ObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape0 = static_cast<const btCompoundShape*>(col0ObjWrap->getCollisionShape());
	m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();

	const btCompoundShape* compoundShape1 = static_cast<const btCompoundShape*>(col1ObjWrap->getCollisionShape());
	m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
	
	
}